

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::SVInt>::emplaceRealloc<slang::SVInt&>
          (SmallVectorBase<slang::SVInt> *this,pointer pos,SVInt *args)

{
  ulong uVar1;
  pointer pSVar2;
  SVInt *__result;
  SVInt *__result_00;
  move_iterator<slang::SVInt_*> __last;
  move_iterator<slang::SVInt_*> __first;
  ulong capacity;
  SVInt *this_00;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  pSVar2 = this->data_;
  __result = (SVInt *)detail::allocArray(capacity,0x10);
  this_00 = (SVInt *)(((long)pos - (long)pSVar2) + (long)__result);
  SVInt::SVInt(this_00,&args->super_SVIntStorage);
  __first._M_current = this->data_;
  __last._M_current = __first._M_current + this->len;
  __result_00 = __result;
  if (__last._M_current != pos) {
    std::__uninitialized_copy<false>::__uninit_copy<std::move_iterator<slang::SVInt*>,slang::SVInt*>
              (__first,(move_iterator<slang::SVInt_*>)pos,__result);
    __last._M_current = this->data_ + this->len;
    __result_00 = this_00 + 1;
    __first._M_current = pos;
  }
  std::__uninitialized_copy<false>::__uninit_copy<std::move_iterator<slang::SVInt*>,slang::SVInt*>
            (__first,__last,__result_00);
  cleanup(this,(EVP_PKEY_CTX *)__last._M_current);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __result;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}